

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instructions.cpp
# Opt level: O0

string * toHexStr_abi_cxx11_(string *__return_storage_ptr__,Argument_t *arg,uint8_t bytes)

{
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_40;
  undefined1 local_1a;
  byte local_19;
  Argument_t *pAStack_18;
  uint8_t bytes_local;
  Argument_t *arg_local;
  string *s;
  
  local_1a = 0;
  local_19 = bytes;
  pAStack_18 = arg;
  arg_local = (Argument_t *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  if (local_19 != 0) {
    toHexStr_abi_cxx11_(&local_40,pAStack_18->at1);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  if (1 < local_19) {
    toHexStr_abi_cxx11_(&local_90,pAStack_18->at2);
    std::operator+(&local_70," ",&local_90);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
  }
  if (2 < local_19) {
    toHexStr_abi_cxx11_(&local_d0,pAStack_18->at3);
    std::operator+(&local_b0," ",&local_d0);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string toHexStr(const Instruction::Argument_t &arg, uint8_t bytes) {
    std::string s;

    if(bytes >= 1) {
        s += toHexStr(arg.at1);
    }
    if(bytes >= 2) {
        s += " " + toHexStr(arg.at2);
    }
    if(bytes >= 3) {
        s += " " + toHexStr(arg.at3);
    }

    return s;
}